

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall DataFrame::print(DataFrame *this,int rows_number)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  ulong local_28;
  size_t j;
  size_t i;
  int rows_number_local;
  DataFrame *this_local;
  
  std::operator<<((ostream *)&std::cout,"Printig data:\n");
  for (j = 0; j < (ulong)(long)rows_number; j = j + 1) {
    local_28 = 0;
    while( true ) {
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->data,j);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar1);
      if (sVar2 <= local_28) break;
      pvVar1 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->data,j);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar1,local_28);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)pvVar3);
      std::operator<<(poVar4," ");
      local_28 = local_28 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DataFrame::print(int rows_number)
{

    std::cout<< "Printig data:\n";
    for (size_t i = 0; i < rows_number; i++) {
        for (size_t j = 0; j < data[i].size(); j++) {
            std::cout << data[i][j] << " ";
        }
        std::cout << std::endl;
    }

}